

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void BlueBold(void)

{
  std::operator<<((ostream *)&std::cout,"\x1b[49m\x1b[1;34m");
  return;
}

Assistant:

void BlueBold()
{
#ifdef _WIN32
	auto h = WinColor();
	SetConsoleTextAttribute(h, FOREGROUND_BLUE | FOREGROUND_INTENSITY);
#else
	std::cout << "\033[49m\033[1;34m";
#endif
}